

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O1

void __thiscall OpenMesh::ArrayKernel::assign_connectivity(ArrayKernel *this,ArrayKernel *_other)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar4;
  PropertyT<OpenMesh::Attributes::StatusInfo> *pPVar5;
  pointer ppBVar6;
  
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
  operator=(&this->vertices_,&_other->vertices_);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::operator=
            (&this->edges_,&_other->edges_);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::operator=
            (&this->faces_,&_other->faces_);
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[2])(this);
  ppBVar1 = (this->super_BaseKernel).vprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this->super_BaseKernel).vprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar1;
      ppBVar6 = ppBVar6 + 1) {
    pBVar2 = *ppBVar6;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var,iVar3));
    }
  }
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])(this);
  ppBVar1 = (this->super_BaseKernel).hprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this->super_BaseKernel).hprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar1;
      ppBVar6 = ppBVar6 + 1) {
    pBVar2 = *ppBVar6;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var_00,iVar3));
    }
  }
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])(this);
  ppBVar1 = (this->super_BaseKernel).eprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this->super_BaseKernel).eprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar1;
      ppBVar6 = ppBVar6 + 1) {
    pBVar2 = *ppBVar6;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var_01,iVar3));
    }
  }
  iVar3 = (*(this->super_BaseKernel)._vptr_BaseKernel[5])(this);
  ppBVar1 = (this->super_BaseKernel).fprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this->super_BaseKernel).fprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar1;
      ppBVar6 = ppBVar6 + 1) {
    pBVar2 = *ppBVar6;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var_02,iVar3));
    }
  }
  if ((_other->vertex_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
      super_BaseHandle.idx_ != -1) {
    if ((this->vertex_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_vertex_status(this);
    }
    pPVar4 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).vprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->vertex_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar5 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(this->super_BaseKernel).vprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->vertex_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseProperty).name_);
    (pPVar5->super_BaseProperty).persistent_ = (pPVar4->super_BaseProperty).persistent_;
    std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ::operator=(&pPVar5->data_,&pPVar4->data_);
  }
  if ((_other->halfedge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
      super_BaseHandle.idx_ != -1) {
    if ((this->halfedge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_halfedge_status(this);
    }
    pPVar4 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).hprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->halfedge_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar5 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(this->super_BaseKernel).hprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->halfedge_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseProperty).name_);
    (pPVar5->super_BaseProperty).persistent_ = (pPVar4->super_BaseProperty).persistent_;
    std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ::operator=(&pPVar5->data_,&pPVar4->data_);
  }
  if ((_other->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
      super_BaseHandle.idx_ != -1) {
    if ((this->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_edge_status(this);
    }
    pPVar4 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).eprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->edge_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar5 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(this->super_BaseKernel).eprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->edge_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>
                        .super_BaseHandle.idx_);
    std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseProperty).name_);
    (pPVar5->super_BaseProperty).persistent_ = (pPVar4->super_BaseProperty).persistent_;
    std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ::operator=(&pPVar5->data_,&pPVar4->data_);
  }
  if ((_other->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
      super_BaseHandle.idx_ != -1) {
    if ((this->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.
        super_BaseHandle.idx_ == -1) {
      request_face_status(this);
    }
    pPVar4 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(_other->super_BaseKernel).fprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (_other->face_status_).
                        super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                        idx_);
    pPVar5 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                       (&(this->super_BaseKernel).fprops_,
                        (BasePropHandleT<OpenMesh::Attributes::StatusInfo>)
                        (this->face_status_).super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>
                        .super_BaseHandle.idx_);
    std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseProperty).name_);
    (pPVar5->super_BaseProperty).persistent_ = (pPVar4->super_BaseProperty).persistent_;
    std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
    ::operator=(&pPVar5->data_,&pPVar4->data_);
    return;
  }
  return;
}

Assistant:

void ArrayKernel::assign_connectivity(const ArrayKernel& _other)
{
  vertices_ = _other.vertices_;
  edges_ = _other.edges_;
  faces_ = _other.faces_;
  
  vprops_resize(n_vertices());
  hprops_resize(n_halfedges());
  eprops_resize(n_edges());
  fprops_resize(n_faces());
  
#define COPY_STATUS_PROPERTY(ENTITY) \
  if (_other.ENTITY##_status_.is_valid()) \
  {   \
    if (!ENTITY##_status_.is_valid()) \
    { \
      request_##ENTITY##_status(); \
    } \
    property(ENTITY##_status_) = _other.property(_other.ENTITY##_status_); \
  }
  COPY_STATUS_PROPERTY(vertex)
  COPY_STATUS_PROPERTY(halfedge)
  COPY_STATUS_PROPERTY(edge)
  COPY_STATUS_PROPERTY(face)
  
#undef COPY_STATUS_PROPERTY
}